

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O0

void __thiscall libtorrent::session_stats_alert::~session_stats_alert(session_stats_alert *this)

{
  session_stats_alert *this_local;
  
  ~session_stats_alert(this);
  operator_delete(this,0x968);
  return;
}

Assistant:

struct TORRENT_EXPORT session_stats_alert final : alert
	{
		// internal
		session_stats_alert(aux::stack_allocator& alloc, counters const& cnt);

#if TORRENT_ABI_VERSION == 1
#ifdef __GNUC__
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wdeprecated-declarations"
#endif
#ifdef __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wdeprecated-declarations"
#endif
#endif
		TORRENT_DEFINE_ALERT_PRIO(session_stats_alert, 70, alert_priority_critical)
#if TORRENT_ABI_VERSION == 1
#ifdef __GNUC__
#pragma GCC diagnostic pop
#endif
#ifdef __clang__
#pragma clang diagnostic pop
#endif
#endif

		static constexpr alert_category_t static_category = alert_category::stats;
		std::string message() const override;

		// An array are a mix of *counters* and *gauges*, which meanings can be
		// queries via the session_stats_metrics() function on the session. The
		// mapping from a specific metric to an index into this array is constant
		// for a specific version of libtorrent, but may differ for other
		// versions. The intended usage is to request the mapping, i.e. call
		// session_stats_metrics(), once on startup, and then use that mapping to
		// interpret these values throughout the process' runtime.
		//
		// For more information, see the session-statistics_ section.
		span<std::int64_t const> counters() const;

#if TORRENT_ABI_VERSION == 1
		std::array<std::int64_t, counters::num_counters> const TORRENT_DEPRECATED_MEMBER values;
#else
	private:
		std::reference_wrapper<aux::stack_allocator const> m_alloc;
		aux::allocation_slot m_counters_idx;
#endif
	}